

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O0

void api_wrapper_test(void)

{
  int iVar1;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char temp [256];
  char bodybuf [256];
  char keybuf [256];
  fdb_status status;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  void *value;
  size_t valuelen;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_kvs_handle **in_stack_fffffffffffffb18;
  fdb_kvs_handle *pfVar2;
  fdb_file_handle *in_stack_fffffffffffffb20;
  size_t in_stack_fffffffffffffb38;
  void *in_stack_fffffffffffffb40;
  void **value_out;
  fdb_kvs_handle *in_stack_fffffffffffffb48;
  void **in_stack_fffffffffffffb50;
  fdb_kvs_handle *in_stack_fffffffffffffb58;
  char local_388 [192];
  fdb_config *in_stack_fffffffffffffd38;
  char *in_stack_fffffffffffffd40;
  fdb_file_handle **in_stack_fffffffffffffd48;
  char local_288 [256];
  void *local_188 [32];
  fdb_status local_84;
  fdb_kvs_handle *local_80;
  void *local_70;
  size_t local_68;
  int local_5c;
  int local_58;
  uint local_54;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  memleak_start();
  local_5c = 10;
  local_58 = system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fdb_open(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  fdb_kvs_open_default
            (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,(fdb_kvs_config *)0x1177b2);
  local_84 = fdb_set_log_callback(local_80,logCallbackFunc,"api_wrapper_test");
  if (local_84 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0xd5b);
    api_wrapper_test::__test_pass = 0;
    if (local_84 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xd5b,"void api_wrapper_test()");
    }
  }
  local_84 = fdb_set_kv(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
                        (size_t)in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,
                        in_stack_fffffffffffffb38);
  if (local_84 != FDB_RESULT_INVALID_ARGS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0xd5f);
    api_wrapper_test::__test_pass = 0;
    if (local_84 != FDB_RESULT_INVALID_ARGS) {
      __assert_fail("status == FDB_RESULT_INVALID_ARGS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xd5f,"void api_wrapper_test()");
    }
  }
  for (local_54 = 0; (int)local_54 < local_5c; local_54 = local_54 + 1) {
    sprintf((char *)local_188,"key%d",(ulong)local_54);
    sprintf(local_288,"body%d",(ulong)local_54);
    in_stack_fffffffffffffb50 = local_188;
    in_stack_fffffffffffffb48 = local_80;
    in_stack_fffffffffffffb58 = (fdb_kvs_handle *)strlen((char *)local_188);
    strlen(local_288);
    local_84 = fdb_set_kv(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
                          (size_t)in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,
                          in_stack_fffffffffffffb38);
    if (local_84 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xd66);
      api_wrapper_test::__test_pass = 0;
      if (local_84 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xd66,"void api_wrapper_test()");
      }
    }
  }
  sprintf((char *)local_188,"key%d",5);
  value_out = local_188;
  pfVar2 = local_80;
  strlen((char *)local_188);
  local_84 = fdb_del_kv(in_stack_fffffffffffffb48,value_out,(size_t)pfVar2);
  if (local_84 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0xd6c);
    api_wrapper_test::__test_pass = 0;
    if (local_84 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xd6c,"void api_wrapper_test()");
    }
  }
  local_84 = fdb_del_kv(in_stack_fffffffffffffb48,value_out,(size_t)pfVar2);
  if (local_84 != FDB_RESULT_INVALID_ARGS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0xd70);
    api_wrapper_test::__test_pass = 0;
    if (local_84 != FDB_RESULT_INVALID_ARGS) {
      __assert_fail("status == FDB_RESULT_INVALID_ARGS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xd70,"void api_wrapper_test()");
    }
  }
  local_54 = 0;
  do {
    if (local_5c <= (int)local_54) {
      local_84 = fdb_get_kv(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
                            (size_t)in_stack_fffffffffffffb48,value_out,(size_t *)pfVar2);
      if (local_84 != FDB_RESULT_INVALID_ARGS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xd85);
        api_wrapper_test::__test_pass = 0;
        if (local_84 != FDB_RESULT_INVALID_ARGS) {
          __assert_fail("status == FDB_RESULT_INVALID_ARGS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xd85,"void api_wrapper_test()");
        }
      }
      strlen((char *)local_188);
      local_84 = fdb_get_kv(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
                            (size_t)in_stack_fffffffffffffb48,value_out,(size_t *)pfVar2);
      pfVar2 = local_80;
      if (local_84 != FDB_RESULT_INVALID_ARGS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xd88);
        api_wrapper_test::__test_pass = 0;
        pfVar2 = local_80;
        if (local_84 != FDB_RESULT_INVALID_ARGS) {
          __assert_fail("status == FDB_RESULT_INVALID_ARGS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xd88,"void api_wrapper_test()");
        }
      }
      fdb_kvs_close(pfVar2);
      fdb_close((fdb_file_handle *)pfVar2);
      fdb_shutdown();
      memleak_end();
      if (api_wrapper_test::__test_pass == 0) {
        fprintf(_stderr,"%s FAILED\n","API wrapper test");
      }
      else {
        fprintf(_stderr,"%s PASSED\n","API wrapper test");
      }
      return;
    }
    sprintf((char *)local_188,"key%d",(ulong)local_54);
    strlen((char *)local_188);
    local_84 = fdb_get_kv(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
                          (size_t)in_stack_fffffffffffffb48,value_out,(size_t *)pfVar2);
    if (local_54 == 5) {
      if (local_84 != FDB_RESULT_KEY_NOT_FOUND) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xd7f);
        api_wrapper_test::__test_pass = 0;
        if (local_84 != FDB_RESULT_KEY_NOT_FOUND) {
          __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xd7f,"void api_wrapper_test()");
        }
      }
    }
    else {
      if (local_84 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xd79);
        api_wrapper_test::__test_pass = 0;
        if (local_84 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xd79,"void api_wrapper_test()");
        }
      }
      sprintf(local_388,"body%d",(ulong)local_54);
      iVar1 = memcmp(local_70,local_388,local_68);
      if (iVar1 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_388,local_70,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xd7b);
        api_wrapper_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xd7b,"void api_wrapper_test()");
      }
      fdb_free_block((void *)0x117ce8);
    }
    local_54 = local_54 + 1;
  } while( true );
}

Assistant:

void api_wrapper_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    size_t valuelen;
    void *value;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_status status;

    char keybuf[256], bodybuf[256], temp[256];

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "api_wrapper_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // error check
    status = fdb_set_kv(db, NULL, 0, NULL, 0);
    TEST_CHK(status == FDB_RESULT_INVALID_ARGS);

    // insert key-value pairs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // remove key5
    sprintf(keybuf, "key%d", 5);
    status = fdb_del_kv(db, keybuf, strlen(keybuf));
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // error check
    status = fdb_del_kv(db, NULL, 0);
    TEST_CHK(status == FDB_RESULT_INVALID_ARGS);

    // retrieve key-value pairs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        status = fdb_get_kv(db, keybuf, strlen(keybuf), &value, &valuelen);

        if (i != 5) {
            // updated documents
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            sprintf(temp, "body%d", i);
            TEST_CMP(value, temp, valuelen);
            fdb_free_block(value);
        } else {
            // removed document
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }
    }

    // error check
    status = fdb_get_kv(db, NULL, 0, &value, &valuelen);
    TEST_CHK(status == FDB_RESULT_INVALID_ARGS);

    status = fdb_get_kv(db, keybuf, strlen(keybuf), NULL, NULL);
    TEST_CHK(status == FDB_RESULT_INVALID_ARGS);

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("API wrapper test");
}